

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha256_datasrc(char *buf,CVmDataSource *src,unsigned_long len)

{
  int iVar1;
  uchar *in_RDX;
  long *in_RSI;
  undefined1 *in_RDI;
  int i;
  char *bufp;
  uchar hash [32];
  int HASH_BYTES;
  size_t cur;
  uchar buf_1 [1024];
  sha256_ctx ctx;
  undefined7 in_stack_fffffffffffffb28;
  uchar in_stack_fffffffffffffb2f;
  uchar *in_stack_fffffffffffffb30;
  int local_4c4;
  sha256_ctx *in_stack_fffffffffffffb40;
  unsigned_long in_stack_fffffffffffffb48;
  uchar *in_stack_fffffffffffffb50;
  uchar *local_490;
  undefined1 local_488 [1032];
  sha256_ctx local_80;
  uchar *local_18;
  long *local_10;
  undefined1 *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sha256_begin(&local_80);
  for (; local_18 != (uchar *)0x0; local_18 = local_18 + -(long)local_490) {
    in_stack_fffffffffffffb30 = local_18;
    if ((uchar *)0x400 < local_18) {
      in_stack_fffffffffffffb30 = (uchar *)0x400;
    }
    local_490 = in_stack_fffffffffffffb30;
    if (in_stack_fffffffffffffb30 != (uchar *)0x0) {
      iVar1 = (**(code **)(*local_10 + 0x18))(local_10,local_488,in_stack_fffffffffffffb30);
      local_490 = (uchar *)(long)iVar1;
    }
    if (local_490 == (uchar *)0x0) break;
    sha256_hash(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  }
  sha256_end(in_stack_fffffffffffffb30,
             (sha256_ctx *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
  for (local_4c4 = 0; local_4c4 < 0x20; local_4c4 = local_4c4 + 1) {
    byte_to_xdigits((char *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2f);
    local_8 = local_8 + 2;
  }
  *local_8 = 0;
  return;
}

Assistant:

void sha256_datasrc(char *buf, CVmDataSource *src, unsigned long len)
{
    /* set up the hash accumulator */
    sha256_ctx ctx;
    sha256_begin(&ctx);

    /* feed the selected range of bytes into the hash */
    while (len != 0)
    {
        /* get a chunk up to one buffer-full, or the total remaining */
        unsigned char buf[1024];
        size_t cur = (len > sizeof(buf) ? sizeof(buf) : (size_t)len);

        /* read the chunk */
        if (cur != 0)
            cur = src->readc(buf, cur);

        /* if there's nothing left, we're done */
        if (cur == 0)
            break;

        /* feed this chunk into the hash */
        sha256_hash(buf, cur, &ctx);

        /* deduct this chunk from the remaining length */
        len -= cur;
    }

    /* calculate the hash result */
    const int HASH_BYTES = 32;
    unsigned char hash[HASH_BYTES];
    sha256_end(hash, &ctx);

    /* convert the binary hash to printable hex digits */
    char *bufp = buf;
    for (int i = 0 ; i < HASH_BYTES ; ++i, bufp += 2)
        byte_to_xdigits(bufp, hash[i]);

    /* null-terminate the string */
    *bufp = '\0';
}